

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,uint16_t aValue,Scope aScope)

{
  ByteArray local_30;
  Scope local_15;
  unsigned_short local_14;
  Type local_11;
  Scope aScope_local;
  uint16_t aValue_local;
  Tlv *pTStack_10;
  Type aType_local;
  Tlv *this_local;
  
  this->mScope = aScope;
  this->mType = aType;
  local_15 = aScope;
  local_14 = aValue;
  local_11 = aType;
  pTStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mValue);
  utils::Encode<unsigned_short>(&local_30,local_14);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mValue,&local_30);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_30);
  return;
}

Assistant:

Tlv::Tlv(Type aType, uint16_t aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
{
    mValue = utils::Encode(aValue);
}